

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

char * Curl_ssl_snihost(Curl_easy *data,char *host,size_t *olen)

{
  ulong local_30;
  size_t len;
  size_t *olen_local;
  char *host_local;
  Curl_easy *data_local;
  
  local_30 = strlen(host);
  if ((local_30 != 0) && (host[local_30 - 1] == '.')) {
    local_30 = local_30 - 1;
  }
  if (local_30 < (data->set).buffer_size) {
    Curl_strntolower((data->state).buffer,host,local_30);
    (data->state).buffer[local_30] = '\0';
    if (olen != (size_t *)0x0) {
      *olen = local_30;
    }
    data_local = (Curl_easy *)(data->state).buffer;
  }
  else {
    data_local = (Curl_easy *)0x0;
  }
  return (char *)data_local;
}

Assistant:

char *Curl_ssl_snihost(struct Curl_easy *data, const char *host, size_t *olen)
{
  size_t len = strlen(host);
  if(len && (host[len-1] == '.'))
    len--;
  if(len >= data->set.buffer_size)
    return NULL;

  Curl_strntolower(data->state.buffer, host, len);
  data->state.buffer[len] = 0;
  if(olen)
    *olen = len;
  return data->state.buffer;
}